

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenGlobalRef
BinaryenAddGlobal(BinaryenModuleRef module,char *name,BinaryenType type,bool mutable_,
                 BinaryenExpressionRef init)

{
  Global *curr;
  undefined3 in_register_00000009;
  Name local_50;
  Expression *local_40;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000009,mutable_);
  local_40 = init;
  curr = (Global *)operator_new(0x50);
  (curr->super_Importable).super_Named.name.super_IString.str._M_len = 0;
  (curr->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&(curr->super_Importable).super_Named.hasExplicitName = 0;
  (curr->super_Importable).module.super_IString.str._M_len = 0;
  (curr->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  (curr->super_Importable).base.super_IString.str._M_len = 0;
  (curr->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  (curr->type).id = 0;
  curr->init = (Expression *)0x0;
  *(undefined8 *)&curr->mutable_ = 0;
  wasm::Name::Name(&local_50,name);
  (curr->super_Importable).super_Named.name.super_IString.str._M_len =
       local_50.super_IString.str._M_len;
  (curr->super_Importable).super_Named.name.super_IString.str._M_str =
       local_50.super_IString.str._M_str;
  (curr->super_Importable).super_Named.hasExplicitName = true;
  (curr->type).id = type;
  curr->mutable_ = SUB41(local_34,0);
  curr->init = local_40;
  wasm::Module::addGlobal(module,curr);
  return curr;
}

Assistant:

BinaryenGlobalRef BinaryenAddGlobal(BinaryenModuleRef module,
                                    const char* name,
                                    BinaryenType type,
                                    bool mutable_,
                                    BinaryenExpressionRef init) {
  auto* ret = new Global();
  ret->setExplicitName(name);
  ret->type = Type(type);
  ret->mutable_ = mutable_;
  ret->init = (Expression*)init;
  ((Module*)module)->addGlobal(ret);
  return ret;
}